

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_any.hpp
# Opt level: O2

any * __thiscall iutest::any::operator=(any *this,any *rhs)

{
  placeholder *ppVar1;
  int iVar2;
  placeholder *__tmp;
  undefined4 extraout_var;
  placeholder *ppVar3;
  
  if (rhs->content == (placeholder *)0x0) {
    ppVar3 = (placeholder *)0x0;
  }
  else {
    iVar2 = (*rhs->content->_vptr_placeholder[3])();
    ppVar3 = (placeholder *)CONCAT44(extraout_var,iVar2);
  }
  ppVar1 = this->content;
  this->content = ppVar3;
  if (ppVar1 != (placeholder *)0x0) {
    (*ppVar1->_vptr_placeholder[1])();
  }
  return this;
}

Assistant:

any& operator = (const any& rhs) { any(rhs).swap(*this); return *this; }